

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

bool __thiscall
nestl::impl::list_const_iterator<int>::operator==
          (list_const_iterator<int> *this,list_const_iterator<int> *other)

{
  list_node_base *plVar1;
  list_node_base *plVar2;
  char *pcVar3;
  
  plVar1 = this->m_node;
  if (plVar1 == (list_node_base *)0x0) {
    pcVar3 = "m_node";
  }
  else if (plVar1->m_prev == (list_node_base *)0x0) {
    pcVar3 = "(m_node)->m_prev";
  }
  else if (plVar1->m_next == (list_node_base *)0x0) {
    pcVar3 = "(m_node)->m_next";
  }
  else if (plVar1->m_prev->m_next == plVar1) {
    if (plVar1->m_next->m_prev == plVar1) {
      plVar2 = other->m_node;
      if (plVar2 == (list_node_base *)0x0) {
        pcVar3 = "other.m_node";
      }
      else if (plVar2->m_prev == (list_node_base *)0x0) {
        pcVar3 = "(other.m_node)->m_prev";
      }
      else if (plVar2->m_next == (list_node_base *)0x0) {
        pcVar3 = "(other.m_node)->m_next";
      }
      else if (plVar2->m_prev->m_next == plVar2) {
        if (plVar2->m_next->m_prev == plVar2) {
          return plVar1 == plVar2;
        }
        pcVar3 = "(other.m_node)->m_next->m_prev == (other.m_node)";
      }
      else {
        pcVar3 = "(other.m_node)->m_prev->m_next == (other.m_node)";
      }
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                    ,0x188,
                    "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
                   );
    }
    pcVar3 = "(m_node)->m_next->m_prev == (m_node)";
  }
  else {
    pcVar3 = "(m_node)->m_prev->m_next == (m_node)";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                ,0x187,
                "bool nestl::impl::list_const_iterator<int>::operator==(const list_const_iterator<T> &) const [T = int]"
               );
}

Assistant:

bool operator==(const list_const_iterator& other) const NESTL_NOEXCEPT_SPEC
    {
        NESTL_CHECK_LIST_NODE(m_node);
        NESTL_CHECK_LIST_NODE(other.m_node);

        return m_node == other.m_node;
    }